

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void communicate(int *file_descriptors,Arguments *args)

{
  __pid_t _Var1;
  pid_t pid;
  Arguments *in_stack_00000088;
  int *in_stack_00000090;
  Arguments *in_stack_000000c8;
  int *in_stack_000000d0;
  
  _Var1 = fork();
  if (_Var1 == -1) {
    throw((char *)0x1025b8);
  }
  if (_Var1 == 0) {
    client_communicate(in_stack_00000090,in_stack_00000088);
  }
  else {
    server_communicate(in_stack_000000d0,in_stack_000000c8);
  }
  return;
}

Assistant:

void communicate(int file_descriptors[2], struct Arguments *args) {
	// For the process ID of the spawned child process
	pid_t pid;

	// Fork a child process
	if ((pid = fork()) == -1) {
		throw("Error forking process");
	}

	// fork() returns 0 for the child process
	if (pid == (pid_t)0) {
		client_communicate(file_descriptors, args);
	}

	else {
		server_communicate(file_descriptors, args);
	}
}